

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

char * qpdf_oh_dict_next_key(qpdf_data qpdf)

{
  QPDF_BOOL QVar1;
  reference pbVar2;
  qpdf_data qpdf_local;
  
  QTC::TC("qpdf","qpdf-c called qpdf_oh_dict_next_key",0);
  QVar1 = qpdf_oh_dict_more_keys(qpdf);
  if (QVar1 == 0) {
    qpdf_local = (qpdf_data)0x0;
  }
  else {
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&qpdf->dict_iter);
    std::__cxx11::string::operator=((string *)&qpdf->cur_dict_key,(string *)pbVar2);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&qpdf->dict_iter);
    qpdf_local = (qpdf_data)std::__cxx11::string::c_str();
  }
  return (char *)qpdf_local;
}

Assistant:

char const*
qpdf_oh_dict_next_key(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_dict_next_key");
    if (qpdf_oh_dict_more_keys(qpdf)) {
        qpdf->cur_dict_key = *qpdf->dict_iter;
        ++qpdf->dict_iter;
        return qpdf->cur_dict_key.c_str();
    } else {
        return nullptr;
    }
}